

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::SolveSOR
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *rhs,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  _ComplexT _Var1;
  long lVar2;
  long lVar3;
  complex<float> *pcVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  float __x;
  float fVar12;
  undefined8 uVar10;
  undefined8 uVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  long local_a0;
  
  lVar2 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  bVar9 = -1 < direction;
  lVar7 = 0;
  if (!bVar9) {
    lVar7 = lVar2 + -1;
  }
  lVar6 = -1;
  if (bVar9) {
    lVar6 = lVar2;
  }
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(x);
  }
  __x = (float)(*tol + *tol);
  if (*numiterations < 1) {
    local_a0 = 0;
  }
  else {
    fVar13 = (float)overrelax;
    local_a0 = 0;
    do {
      lVar2 = lVar7;
      if ((double)__x < *tol) break;
      for (; lVar2 != lVar6; lVar2 = lVar2 + (ulong)bVar9 * 2 + -1) {
        _Var1 = rhs->fElem[lVar2]._M_value;
        fVar18 = (float)_Var1;
        fVar19 = (float)(_Var1 >> 0x20);
        plVar5 = (this->fIA).fStore;
        for (lVar8 = plVar5[lVar2]; lVar8 < plVar5[lVar2 + 1]; lVar8 = lVar8 + 1) {
          lVar3 = (this->fJA).fStore[lVar8];
          if (((lVar3 < 0) ||
              ((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar3)) ||
             ((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          _Var1 = (this->fA).fStore[lVar8]._M_value;
          fVar17 = (float)_Var1;
          fVar12 = (float)(_Var1 >> 0x20);
          _Var1 = x->fElem[lVar3]._M_value;
          fVar15 = (float)(_Var1 >> 0x20);
          fVar14 = (float)_Var1 * fVar17 - fVar15 * fVar12;
          fVar16 = fVar17 * fVar15 + fVar12 * (float)_Var1;
          uVar10 = CONCAT44(fVar16,fVar14);
          if ((NAN(fVar14)) && (uVar10 = CONCAT44(fVar16,fVar14), NAN(fVar16))) {
            uVar10 = __mulsc3(fVar17,fVar12,_Var1,fVar15);
          }
          fVar18 = fVar18 - (float)uVar10;
          fVar19 = fVar19 - (float)((ulong)uVar10 >> 0x20);
          plVar5 = (this->fIA).fStore;
        }
        if (NAN(fVar18 * fVar18 - fVar19 * fVar19)) {
          TPZFYsmpMatrix<std::complex<float>>::SolveSOR();
        }
        pcVar4 = (this->fDiag).fStore;
        uVar11 = __divsc3(fVar18,fVar19,(int)pcVar4[lVar2]._M_value,
                          *(undefined4 *)((long)&pcVar4[lVar2]._M_value + 4));
        fVar18 = (float)((ulong)uVar11 >> 0x20);
        fVar19 = (float)uVar11 * fVar13 - fVar18 * 0.0;
        fVar17 = (float)uVar11 * 0.0 + fVar18 * fVar13;
        uVar10 = CONCAT44(fVar17,fVar19);
        if ((NAN(fVar19)) && (uVar10 = CONCAT44(fVar17,fVar19), NAN(fVar17))) {
          uVar10 = __mulsc3(fVar13,0,uVar11,fVar18);
        }
        if (((lVar2 < 0) ||
            ((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar2)) ||
           ((x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        _Var1 = x->fElem[lVar2]._M_value;
        x->fElem[lVar2]._M_value =
             CONCAT44((float)((ulong)uVar10 >> 0x20) + (float)(_Var1 >> 0x20),
                      (float)uVar10 + (float)_Var1);
      }
      if (__x < 0.0) {
        __x = sqrtf(__x);
      }
      else {
        __x = SQRT(__x);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 < *numiterations);
  }
  *tol = (double)__x;
  *numiterations = local_a0;
  if (residual == (TPZFMatrix<std::complex<float>_> *)0x0) {
    return;
  }
  (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x28])(this,x,rhs,residual);
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::SolveSOR( int64_t &numiterations, const TPZFMatrix<TVar> &rhs, TPZFMatrix<TVar> &x,
							  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/,
							  const REAL overrelax, REAL &tol,
							  const int FromCurrent,const int direction ) {
	
	//    if(!fDiag) ComputeDiagonal();
	int64_t irStart = 0,irLast = this->Rows(),irInc = 1;
	if(direction < 0) {
		irStart = this->Rows()-1;
		irLast = -1;
		irInc = -1;
	}
	if(!FromCurrent) x.Zero();
	RTVar eqres = 2.*tol;
	int64_t iteration;
	for(iteration=0; iteration<numiterations && eqres >= tol; iteration++) {
		TVar local_eqres = 0.;
		int64_t ir=irStart;
		while(ir != irLast) {
			TVar xnewval=rhs.g(ir,0);
			for(int64_t ic=fIA[ir]; ic<fIA[ir+1]; ic++) {
				xnewval -= fA[ic] * x(fJA[ic],0);
			}
			local_eqres += xnewval*xnewval;
			x(ir,0) += (TVar)overrelax*(xnewval/fDiag[ir]);
			ir += irInc;
		}
		eqres = sqrt(eqres);
	}
	tol = eqres;
	numiterations = iteration;
	if(residual) this->Residual(x,rhs,*residual);
}